

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierParser.cpp
# Opt level: O1

void __thiscall Refal2::CQualifierParser::addWord(CQualifierParser *this)

{
  CQualifierBuilder *this_00;
  int *piVar1;
  byte bVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  bool bVar7;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  bVar7 = (this->token).word._M_string_length != 0;
  if (bVar7) {
    this_00 = &this->builder;
    uVar6 = 0;
    do {
      bVar2 = (this->token).word._M_dataplus._M_p[uVar6];
      if (0x61 < bVar2) {
        switch(bVar2) {
        case 0x62:
          goto switchD_0012f099_caseD_42;
        case 99:
        case 0x65:
        case 0x67:
        case 0x68:
        case 0x69:
        case 0x6a:
        case 0x6b:
        case 0x6d:
          break;
        case 100:
          goto switchD_0012f099_caseD_44;
        case 0x66:
          goto switchD_0012f099_caseD_46;
        case 0x6c:
          goto switchD_0012f099_caseD_4c;
        case 0x6e:
          goto switchD_0012f099_caseD_4e;
        case 0x6f:
          goto switchD_0012f099_caseD_4f;
        default:
          if (bVar2 == 0x77) {
LAB_0012f10f:
            CQualifierBuilder::AddW(this_00);
            goto LAB_0012f117;
          }
          if (bVar2 == 0x73) goto LAB_0012f0cd;
        }
        goto switchD_0012f099_caseD_43;
      }
      switch(bVar2) {
      case 0x42:
switchD_0012f099_caseD_42:
        CQualifierBuilder::AddB(this_00);
        break;
      case 0x43:
      case 0x45:
      case 0x47:
      case 0x48:
      case 0x49:
      case 0x4a:
      case 0x4b:
      case 0x4d:
        goto switchD_0012f099_caseD_43;
      case 0x44:
switchD_0012f099_caseD_44:
        CQualifierBuilder::AddD(this_00);
        break;
      case 0x46:
switchD_0012f099_caseD_46:
        CQualifierBuilder::AddF(this_00);
        break;
      case 0x4c:
switchD_0012f099_caseD_4c:
        CQualifierBuilder::AddL(this_00);
        break;
      case 0x4e:
switchD_0012f099_caseD_4e:
        CQualifierBuilder::AddN(this_00);
        break;
      case 0x4f:
switchD_0012f099_caseD_4f:
        CQualifierBuilder::AddO(this_00);
        break;
      default:
        if (bVar2 == 0x53) {
LAB_0012f0cd:
          CQualifierBuilder::AddF(this_00);
          CQualifierBuilder::AddN(this_00);
          goto switchD_0012f099_caseD_4f;
        }
        if (bVar2 == 0x57) goto LAB_0012f10f;
        goto switchD_0012f099_caseD_43;
      }
LAB_0012f117:
      uVar6 = uVar6 + 1;
      bVar7 = uVar6 < (this->token).word._M_string_length;
    } while (bVar7);
  }
LAB_0012f12b:
  this->afterRightParen = false;
  return;
switchD_0012f099_caseD_43:
  piVar1 = &(this->token).position;
  *piVar1 = *piVar1 + (int)uVar6;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x13a3f7);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_70.field_2._M_allocated_capacity = *psVar5;
    local_70.field_2._8_8_ = plVar3[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar5;
    local_70._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_70._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  error(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (bVar7) {
    return;
  }
  goto LAB_0012f12b;
}

Assistant:

void CQualifierParser::addWord()
{
	for( std::string::size_type i = 0; i < token.word.length(); i++ ) {
		switch( token.word[i] ) {
			case 's': case 'S':
				builder.AddS();
				break;
			case 'f': case 'F':
				builder.AddF();
				break;
			case 'n': case 'N':
				builder.AddN();
				break;
			case 'o': case 'O':
				builder.AddO();
				break;
			case 'l': case 'L':
				builder.AddL();
				break;
			case 'd': case 'D':
				builder.AddD();
				break;
			case 'w': case 'W':
				builder.AddW();
				break;
			case 'b': case 'B':
				builder.AddB();
				break;
			default:
				token.position += i;
				error( "primary qualifier `" +
					std::string( 1, token.word[i] ) + "` does not exist" );
				return;
		}
	}
	afterRightParen = false;
}